

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void resetAccumulator(Parse *pParse,AggInfo *pAggInfo)

{
  Vdbe *p;
  Expr *pEVar1;
  KeyInfo *zP4;
  KeyInfo *pKeyInfo;
  Expr *pE;
  AggInfo_func *pAStack_30;
  int nReg;
  AggInfo_func *pFunc;
  int i;
  Vdbe *v;
  AggInfo *pAggInfo_local;
  Parse *pParse_local;
  
  p = pParse->pVdbe;
  if (pAggInfo->nFunc + pAggInfo->nColumn != 0) {
    sqlite3VdbeAddOp3(p,0x3b,0,pAggInfo->mnReg,pAggInfo->mxReg);
    pAStack_30 = pAggInfo->aFunc;
    for (pFunc._4_4_ = 0; pFunc._4_4_ < pAggInfo->nFunc; pFunc._4_4_ = pFunc._4_4_ + 1) {
      if (-1 < pAStack_30->iDistinct) {
        pEVar1 = pAStack_30->pExpr;
        if (((pEVar1->x).pList == (ExprList *)0x0) || (((pEVar1->x).pList)->nExpr != 1)) {
          sqlite3ErrorMsg(pParse,"DISTINCT aggregates must have exactly one argument");
          pAStack_30->iDistinct = -1;
        }
        else {
          zP4 = keyInfoFromExprList(pParse,(pEVar1->x).pList,0,0);
          sqlite3VdbeAddOp4(p,0x6c,pAStack_30->iDistinct,0,0,(char *)zP4,-9);
        }
      }
      pAStack_30 = pAStack_30 + 1;
    }
  }
  return;
}

Assistant:

static void resetAccumulator(Parse *pParse, AggInfo *pAggInfo){
  Vdbe *v = pParse->pVdbe;
  int i;
  struct AggInfo_func *pFunc;
  int nReg = pAggInfo->nFunc + pAggInfo->nColumn;
  if( nReg==0 ) return;
#ifdef SQLITE_DEBUG
  /* Verify that all AggInfo registers are within the range specified by
  ** AggInfo.mnReg..AggInfo.mxReg */
  assert( nReg==pAggInfo->mxReg-pAggInfo->mnReg+1 );
  for(i=0; i<pAggInfo->nColumn; i++){
    assert( pAggInfo->aCol[i].iMem>=pAggInfo->mnReg
         && pAggInfo->aCol[i].iMem<=pAggInfo->mxReg );
  }
  for(i=0; i<pAggInfo->nFunc; i++){
    assert( pAggInfo->aFunc[i].iMem>=pAggInfo->mnReg
         && pAggInfo->aFunc[i].iMem<=pAggInfo->mxReg );
  }
#endif
  sqlite3VdbeAddOp3(v, OP_Null, 0, pAggInfo->mnReg, pAggInfo->mxReg);
  for(pFunc=pAggInfo->aFunc, i=0; i<pAggInfo->nFunc; i++, pFunc++){
    if( pFunc->iDistinct>=0 ){
      Expr *pE = pFunc->pExpr;
      assert( !ExprHasProperty(pE, EP_xIsSelect) );
      if( pE->x.pList==0 || pE->x.pList->nExpr!=1 ){
        sqlite3ErrorMsg(pParse, "DISTINCT aggregates must have exactly one "
           "argument");
        pFunc->iDistinct = -1;
      }else{
        KeyInfo *pKeyInfo = keyInfoFromExprList(pParse, pE->x.pList, 0, 0);
        sqlite3VdbeAddOp4(v, OP_OpenEphemeral, pFunc->iDistinct, 0, 0,
                          (char*)pKeyInfo, P4_KEYINFO);
      }
    }
  }
}